

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void backward::SignalHandling::handleSignal(int param_1,siginfo_t *info,void *_ctx)

{
  StackTrace st;
  Printer printer;
  
  st.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder._stacktrace.
  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  st.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder._stacktrace.
  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  st.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder._stacktrace.
  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  st.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  super_StackTraceImplBase._context = (void *)0x0;
  st.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  super_StackTraceImplBase._error_addr = (void *)0x0;
  st.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  super_StackTraceImplBase._thread_id = 0;
  st.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
  super_StackTraceImplBase._skip = 0;
  if (*(void **)((long)_ctx + 0xa8) == (void *)0x0) {
    StackTraceImpl<backward::system_tag::linux_tag>::load_here
              (&st.super_StackTraceImpl<backward::system_tag::linux_tag>,0x20,_ctx,
               (info->_sifields)._sigfault.si_addr);
  }
  else {
    StackTraceImpl<backward::system_tag::linux_tag>::load_from
              (&st.super_StackTraceImpl<backward::system_tag::linux_tag>,
               *(void **)((long)_ctx + 0xa8),0x20,_ctx,(info->_sifields)._sigfault.si_addr);
  }
  Printer::Printer(&printer);
  printer.address = true;
  Printer::print<backward::StackTrace>(&printer,&st,_stderr);
  psiginfo((siginfo_t *)info,(char *)0x0);
  Printer::~Printer(&printer);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&st.super_StackTraceImpl<backward::system_tag::linux_tag>.super_StackTraceImplHolder.
              _stacktrace.super__Vector_base<void_*,_std::allocator<void_*>_>);
  return;
}

Assistant:

static void handleSignal(int, siginfo_t *info, void *_ctx) {
    ucontext_t *uctx = static_cast<ucontext_t *>(_ctx);

    StackTrace st;
    void *error_addr = nullptr;
#ifdef REG_RIP // x86_64
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.gregs[REG_RIP]);
#elif defined(REG_EIP) // x86_32
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.gregs[REG_EIP]);
#elif defined(__arm__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.arm_pc);
#elif defined(__aarch64__)
    #if defined(__APPLE__)
      error_addr = reinterpret_cast<void *>(uctx->uc_mcontext->__ss.__pc);
    #else
      error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.pc);
    #endif
#elif defined(__mips__)
    error_addr = reinterpret_cast<void *>(
        reinterpret_cast<struct sigcontext *>(&uctx->uc_mcontext)->sc_pc);
#elif defined(__ppc__) || defined(__powerpc) || defined(__powerpc__) ||        \
    defined(__POWERPC__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.regs->nip);
#elif defined(__riscv)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.__gregs[REG_PC]);
#elif defined(__s390x__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext.psw.addr);
#elif defined(__APPLE__) && defined(__x86_64__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext->__ss.__rip);
#elif defined(__APPLE__)
    error_addr = reinterpret_cast<void *>(uctx->uc_mcontext->__ss.__eip);
#else
#warning ":/ sorry, ain't know no nothing none not of your architecture!"
#endif
    if (error_addr) {
      st.load_from(error_addr, 32, reinterpret_cast<void *>(uctx),
                   info->si_addr);
    } else {
      st.load_here(32, reinterpret_cast<void *>(uctx), info->si_addr);
    }

    Printer printer;
    printer.address = true;
    printer.print(st, stderr);

#if (defined(_XOPEN_SOURCE) && _XOPEN_SOURCE >= 700) || \
    (defined(_POSIX_C_SOURCE) && _POSIX_C_SOURCE >= 200809L)
    psiginfo(info, nullptr);
#else
    (void)info;
#endif
  }